

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

void glcts::ArraysOfArrays::initializeMap<glcts::ArraysOfArrays::Interface::GL>(void)

{
  mapped_type *pmVar1;
  long lVar2;
  key_type local_104 [64];
  int temp_index;
  
  local_104[0x3e] = 1;
  local_104[0x3d] = 0;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 0x3d);
  var_descriptor::operator=(pmVar1,(var_descriptor *)var_descriptors);
  lVar2 = (long)(int)local_104[0x3e];
  local_104[0x3c] = 1;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 0x3c);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[0x3b] = 2;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 0x3b);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[0x3a] = 3;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 0x3a);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[0x39] = 4;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 0x39);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[0x38] = 5;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 0x38);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[0x37] = 6;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 0x37);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[0x36] = 7;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 0x36);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[0x35] = 8;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 0x35);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[0x34] = 9;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 0x34);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[0x33] = 10;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 0x33);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[0x32] = 0xb;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 0x32);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[0x31] = 0xc;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 0x31);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[0x30] = 0xd;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 0x30);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[0x2f] = 0xe;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 0x2f);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[0x2e] = 0xf;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 0x2e);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[0x2d] = 0x10;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 0x2d);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[0x2c] = 0x11;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 0x2c);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[0x2b] = 0x12;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 0x2b);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[0x2a] = 0x13;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 0x2a);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[0x29] = 0x14;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 0x29);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[0x28] = 0x15;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 0x28);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[0x27] = 0x16;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 0x27);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[0x26] = 0x17;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 0x26);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[0x25] = 0x18;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 0x25);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[0x24] = 0x19;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 0x24);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[0x23] = 0x1a;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 0x23);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[0x22] = 0x1b;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 0x22);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[0x21] = 0x1c;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 0x21);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[0x20] = 0x1d;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 0x20);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[0x1f] = 0x1e;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 0x1f);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[0x1e] = 0x1f;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 0x1e);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[0x1d] = 0x20;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 0x1d);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[0x1c] = 0x21;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 0x1c);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[0x1b] = 0x22;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 0x1b);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[0x1a] = 0x23;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 0x1a);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[0x19] = 0x24;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 0x19);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[0x18] = 0x25;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 0x18);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[0x17] = 0x26;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 0x17);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[0x16] = 0x27;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 0x16);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[0x15] = 0x28;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 0x15);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[0x14] = 0x29;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 0x14);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[0x13] = 0x2a;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 0x13);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[0x12] = 0x2b;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 0x12);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[0x11] = 0x2c;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 0x11);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[0x10] = 0x2d;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 0x10);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[0xf] = 0x2e;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 0xf);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[0xe] = 0x2f;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 0xe);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[0xd] = 0x30;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 0xd);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_descriptors + lVar2 * 0x160));
  local_104[0x3e] = 1;
  local_104[0xc] = 0x31;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 0xc);
  var_descriptor::operator=(pmVar1,(var_descriptor *)var_double_descriptors);
  lVar2 = (long)(int)local_104[0x3e];
  local_104[0xb] = 0x32;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 0xb);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_double_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[10] = 0x33;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 10);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_double_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[9] = 0x34;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 9);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_double_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[8] = 0x35;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 8);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_double_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[7] = 0x36;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 7);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_double_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[6] = 0x37;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 6);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_double_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[5] = 0x38;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 5);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_double_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[4] = 0x39;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 4);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_double_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[3] = 0x3a;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 3);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_double_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[2] = 0x3b;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 2);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_double_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[1] = 0x3c;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104 + 1);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_double_descriptors + lVar2 * 0x160));
  lVar2 = (long)(int)local_104[0x3e];
  local_104[0] = VAR_TYPE_DMAT4X4;
  local_104[0x3e] = local_104[0x3e] + 1;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,local_104);
  var_descriptor::operator=(pmVar1,(var_descriptor *)(var_double_descriptors + lVar2 * 0x160));
  return;
}

Assistant:

void initializeMap()
{
	int temp_index = 0;

	// Set up the map
	supported_variable_types_map[VAR_TYPE_BOOL]					= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_INT]					= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_UINT]					= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_FLOAT]				= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_VEC2]					= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_VEC3]					= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_VEC4]					= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_BVEC2]				= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_BVEC3]				= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_BVEC4]				= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_IVEC2]				= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_IVEC3]				= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_IVEC4]				= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_UVEC2]				= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_UVEC3]				= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_UVEC4]				= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_MAT2]					= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_MAT3]					= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_MAT4]					= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_MAT2X2]				= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_MAT2X3]				= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_MAT2X4]				= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_MAT3X2]				= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_MAT3X3]				= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_MAT3X4]				= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_MAT4X2]				= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_MAT4X3]				= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_MAT4X4]				= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_IMAGEBUFFER]			= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_IIMAGEBUFFER]			= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_UIMAGEBUFFER]			= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_SAMPLERBUFFER]		= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_ISAMPLERBUFFER]		= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_USAMPLERBUFFER]		= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_SAMPLER2D]			= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_SAMPLER3D]			= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_SAMPLERCUBE]			= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_SAMPLERCUBESHADOW]	= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_SAMPLER2DSHADOW]		= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_SAMPLER2DARRAY]		= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_SAMPLER2DARRAYSHADOW] = var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_ISAMPLER2D]			= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_ISAMPLER3D]			= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_ISAMPLERCUBE]			= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_ISAMPLER2DARRAY]		= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_USAMPLER2D]			= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_USAMPLER3D]			= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_USAMPLERCUBE]			= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_USAMPLER2DARRAY]		= var_descriptors[temp_index++];

	if (API::USE_DOUBLE)
	{
		temp_index = 0;

		supported_variable_types_map[VAR_TYPE_DOUBLE]  = var_double_descriptors[temp_index++];
		supported_variable_types_map[VAR_TYPE_DMAT2]   = var_double_descriptors[temp_index++];
		supported_variable_types_map[VAR_TYPE_DMAT3]   = var_double_descriptors[temp_index++];
		supported_variable_types_map[VAR_TYPE_DMAT4]   = var_double_descriptors[temp_index++];
		supported_variable_types_map[VAR_TYPE_DMAT2X2] = var_double_descriptors[temp_index++];
		supported_variable_types_map[VAR_TYPE_DMAT2X3] = var_double_descriptors[temp_index++];
		supported_variable_types_map[VAR_TYPE_DMAT2X4] = var_double_descriptors[temp_index++];
		supported_variable_types_map[VAR_TYPE_DMAT3X2] = var_double_descriptors[temp_index++];
		supported_variable_types_map[VAR_TYPE_DMAT3X3] = var_double_descriptors[temp_index++];
		supported_variable_types_map[VAR_TYPE_DMAT3X4] = var_double_descriptors[temp_index++];
		supported_variable_types_map[VAR_TYPE_DMAT4X2] = var_double_descriptors[temp_index++];
		supported_variable_types_map[VAR_TYPE_DMAT4X3] = var_double_descriptors[temp_index++];
		supported_variable_types_map[VAR_TYPE_DMAT4X4] = var_double_descriptors[temp_index++];
	}
}